

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_widgets.h
# Opt level: O2

void __thiscall dlib::tooltip::set_size(tooltip *this,unsigned_long width,unsigned_long height)

{
  undefined1 auVar1 [16];
  long lVar2;
  long lVar3;
  auto_mutex M;
  
  M.r = (this->super_mouse_over_event).super_drawable.m;
  M.m = (mutex *)0x0;
  M.rw = (read_write_mutex *)0x0;
  rmutex::lock(M.r,1);
  lVar2 = (width - 1) + (this->super_mouse_over_event).super_drawable.rect.l;
  lVar3 = (height - 1) + (this->super_mouse_over_event).super_drawable.rect.t;
  auVar1._8_4_ = (int)lVar3;
  auVar1._0_8_ = lVar2;
  auVar1._12_4_ = (int)((ulong)lVar3 >> 0x20);
  (this->super_mouse_over_event).super_drawable.rect.r = lVar2;
  (this->super_mouse_over_event).super_drawable.rect.b = auVar1._8_8_;
  auto_mutex::~auto_mutex(&M);
  return;
}

Assistant:

void set_size (
            unsigned long width, 
            unsigned long height 
        )
        {
            auto_mutex M(m);
            rect = resize_rect(rect,width,height);
        }